

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_xori_i64_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  uintptr_t o_6;
  TCGOp *pTVar1;
  TCGv_i64 pTVar2;
  uintptr_t o_1;
  TCGOpcode opc;
  uintptr_t o;
  
  if (arg2 == -1) {
    opc = INDEX_op_not_i64;
  }
  else {
    if (arg2 != 0) {
      pTVar2 = tcg_const_i64_sparc64(tcg_ctx,arg2);
      pTVar1 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_xor_i64);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
      pTVar1->args[2] = (TCGArg)(pTVar2 + (long)tcg_ctx);
      tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      return;
    }
    if (ret == arg1) {
      return;
    }
    opc = INDEX_op_mov_i64;
  }
  pTVar1 = tcg_emit_op_sparc64(tcg_ctx,opc);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_xori_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_xori_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), arg2);
        tcg_gen_xori_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), arg2 >> 32);
        return;
#else
    /* Some cases can be optimized here.  */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else if (arg2 == -1 && TCG_TARGET_HAS_not_i64) {
        /* Don't recurse with tcg_gen_not_i64.  */
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_not_i64, ret, arg1);
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_xor_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
#endif
}